

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

WebData AllocUserData(void)

{
  WebData paVar1;
  sunrealtype **ppsVar2;
  sunindextype *psVar3;
  N_Vector p_Var4;
  WebData wdata;
  sunindextype ns;
  int ngrp;
  int i;
  int local_4;
  
  paVar1 = (WebData)malloc(0x9958);
  for (local_4 = 0; local_4 < 4; local_4 = local_4 + 1) {
    ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
    paVar1->P[local_4] = ppsVar2;
    psVar3 = (sunindextype *)SUNDlsMat_newIndexArray(6);
    paVar1->pivot[local_4] = psVar3;
  }
  p_Var4 = (N_Vector)N_VNew_Serial(0x961,sunctx);
  paVar1->rewt = p_Var4;
  p_Var4 = (N_Vector)N_VNew_Serial(0x961,sunctx);
  paVar1->vtemp = p_Var4;
  p_Var4 = (N_Vector)N_VNew_Serial(0x960,sunctx);
  paVar1->rewtB = p_Var4;
  p_Var4 = (N_Vector)N_VNew_Serial(0x960,sunctx);
  paVar1->vtempB = p_Var4;
  return paVar1;
}

Assistant:

static WebData AllocUserData(void)
{
  int i, ngrp = NGRP;
  sunindextype ns = NS;
  WebData wdata;

  wdata = (WebData)malloc(sizeof *wdata);
  for (i = 0; i < ngrp; i++)
  {
    (wdata->P)[i]     = SUNDlsMat_newDenseMat(ns, ns);
    (wdata->pivot)[i] = SUNDlsMat_newIndexArray(ns);
  }
  wdata->rewt   = N_VNew_Serial(NEQ + 1, sunctx);
  wdata->vtemp  = N_VNew_Serial(NEQ + 1, sunctx);
  wdata->rewtB  = N_VNew_Serial(NEQ, sunctx);
  wdata->vtempB = N_VNew_Serial(NEQ, sunctx);

  return (wdata);
}